

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

void __thiscall
leveldb::anon_unknown_1::PosixWritableFile::~PosixWritableFile(PosixWritableFile *this)

{
  long in_FS_OFFSET;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < this->fd_) {
    Close((PosixWritableFile *)&stack0xffffffffffffffe8);
    Status::~Status((Status *)&stack0xffffffffffffffe8);
  }
  std::__cxx11::string::~string((string *)&this->dirname_);
  std::__cxx11::string::~string((string *)&this->filename_);
  WritableFile::~WritableFile(&this->super_WritableFile);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~PosixWritableFile() override {
    if (fd_ >= 0) {
      // Ignoring any potential errors
      Close();
    }
  }